

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O1

bool __thiscall Scs::Socket::IsInvalid(Socket *this)

{
  int iVar1;
  uint *puVar2;
  int iVar3;
  bool bVar4;
  timeval tmval;
  fd_set socketSet;
  timeval local_98;
  fd_set local_88;
  
  iVar1 = this->m_socket;
  if (iVar1 == -1) {
    bVar4 = true;
  }
  else {
    local_88.fds_bits[0xe] = 0;
    local_88.fds_bits[0xf] = 0;
    local_88.fds_bits[0xc] = 0;
    local_88.fds_bits[0xd] = 0;
    local_88.fds_bits[10] = 0;
    local_88.fds_bits[0xb] = 0;
    local_88.fds_bits[8] = 0;
    local_88.fds_bits[9] = 0;
    local_88.fds_bits[6] = 0;
    local_88.fds_bits[7] = 0;
    local_88.fds_bits[4] = 0;
    local_88.fds_bits[5] = 0;
    local_88.fds_bits[2] = 0;
    local_88.fds_bits[3] = 0;
    local_88.fds_bits[0] = 0;
    local_88.fds_bits[1] = 0;
    iVar3 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar3 = iVar1;
    }
    local_88.fds_bits[iVar3 >> 6] = local_88.fds_bits[iVar3 >> 6] | 1L << ((byte)iVar1 & 0x3f);
    local_98.tv_sec = 0;
    local_98.tv_usec = 1000;
    iVar1 = select(iVar1 + 1,(fd_set *)0x0,(fd_set *)0x0,&local_88,&local_98);
    if (iVar1 == -1) {
      puVar2 = (uint *)__errno_location();
      bVar4 = false;
      LogWriteLine("Socket IsInvalid() failed: %d",(ulong)*puVar2);
    }
    else {
      bVar4 = iVar1 == 1;
    }
  }
  return bVar4;
}

Assistant:

bool Socket::IsInvalid() const
{
	if (m_socket == INVALID_SOCKET)
		return true;
	fd_set socketSet;
	FD_ZERO(&socketSet);
	FD_SET(m_socket, &socketSet);
	timeval tmval;
	tmval.tv_sec = 0;
	tmval.tv_usec = 1000;
	int result = select(static_cast<int>(m_socket + 1), nullptr, nullptr, &socketSet, &tmval);
	int lastError = SocketLastError;
	if (result == SOCKET_ERROR)
	{
		LogWriteLine("Socket IsInvalid() failed: %d", lastError);
		return false;
	}
	return (result == 1) ? true : false;
}